

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Cfs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint fDagNodes;
  uint fVerbose;
  uint uVar2;
  uint fConstSim;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  double dVar6;
  uint local_68;
  uint local_64;
  uint local_60;
  float local_5c;
  uint local_58;
  uint local_54;
  
  local_68 = 0;
  Extra_UtilGetoptReset();
  local_58 = 2;
  local_64 = 1;
  local_60 = 2;
  local_54 = 0;
  fConstSim = 0;
  fDagNodes = 0;
  local_5c = 0.0;
  fVerbose = 0;
LAB_00293d08:
  while (iVar1 = Extra_UtilGetopt(argc,argv,"LNURPrcdvh"), iVar5 = globalUtilOptind, 0x62 < iVar1) {
    if (iVar1 < 0x72) {
      if (iVar1 == 99) {
        fConstSim = fConstSim ^ 1;
      }
      else {
        if (iVar1 != 100) goto switchD_00293d2d_caseD_4d;
        fDagNodes = fDagNodes ^ 1;
      }
    }
    else if (iVar1 == 0x72) {
      local_54 = local_54 ^ 1;
    }
    else {
      if (iVar1 != 0x76) goto switchD_00293d2d_caseD_4d;
      fVerbose = fVerbose ^ 1;
    }
  }
  switch(iVar1) {
  case 0x4c:
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-L\" should be followed by an integer.\n";
LAB_00293ef0:
      Abc_Print(-1,pcVar4);
      goto switchD_00293d2d_caseD_4d;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_68 = uVar2;
    break;
  case 0x4d:
  case 0x4f:
  case 0x51:
  case 0x53:
  case 0x54:
    goto switchD_00293d2d_caseD_4d;
  case 0x4e:
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-N\" should be followed by an integer.\n";
      goto LAB_00293ef0;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_64 = uVar2;
    break;
  case 0x50:
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-P\" should be followed by an integer.\n";
      goto LAB_00293ef0;
    }
    dVar6 = atof(argv[globalUtilOptind]);
    local_5c = (float)dVar6;
    globalUtilOptind = iVar5 + 1;
    if (local_5c < 0.0) {
switchD_00293d2d_caseD_4d:
      Abc_Print(-2,"usage: &cfs [-LNURPrcdvh]\n");
      Abc_Print(-2,"\t          performs simulation\n");
      Abc_Print(-2,"\t-L num  : the limit on the number of occurrences [default = %d]\n",
                (ulong)local_68);
      Abc_Print(-2,"\t-N num  : the number of repetions of each pattern [default = %d]\n",
                (ulong)local_64);
      Abc_Print(-2,"\t-U num  : what to do with unseen patterns [default = %d]\n",(ulong)local_58);
      Abc_Print(-2,"\t-R num  : what to do with rare patterns [default = %d]\n",(ulong)local_60);
      Abc_Print(-2,"\t-P num  : base2-log of ramdom flip probability [default = %f]\n",
                (double)local_5c);
      pcVar3 = "yes";
      pcVar4 = "yes";
      if (local_54 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-r      : toggle replacing rare patterns [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (fConstSim == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-c      : toggle inserting constants [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (fDagNodes == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-d      : toggle using only DAG nodes [default = %s]\n",pcVar4);
      if (fVerbose == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-v      : toggle printing verbose information [default = %s]\n",pcVar3);
      pcVar4 = "\t-h      : print the command usage\n";
      iVar5 = -2;
LAB_0029402f:
      Abc_Print(iVar5,pcVar4);
      return 1;
    }
    goto LAB_00293d08;
  case 0x52:
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-R\" should be followed by an integer.\n";
      goto LAB_00293ef0;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_60 = uVar2;
    break;
  case 0x55:
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-U\" should be followed by an integer.\n";
      goto LAB_00293ef0;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_58 = uVar2;
    break;
  default:
    if (iVar1 == -1) {
      if (pAbc->pGia != (Gia_Man_t *)0x0) {
        Extra_CommandCfs(pAbc->pGia,local_68,local_64,local_58,local_60,local_54,fConstSim,fDagNodes
                         ,local_5c,fVerbose);
        return 0;
      }
      pcVar4 = "Abc_CommandAbc9Cfs(): There is no AIG.\n";
      iVar5 = -1;
      goto LAB_0029402f;
    }
    goto switchD_00293d2d_caseD_4d;
  }
  globalUtilOptind = iVar5 + 1;
  if ((int)uVar2 < 0) goto switchD_00293d2d_caseD_4d;
  goto LAB_00293d08;
}

Assistant:

int Abc_CommandAbc9Cfs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Extra_CommandCfs( Gia_Man_t * pGia, int Limit, int Reps, int UnseenUse, int RareUse, int fReplaceRare, int fConstSim, int fDagNodes, float FlipProb, int fVerbose );
    int Limit       =   0;
    int Reps        =   1;
    int UnseenUse   =   2;
    int RareUse     =   2;
    int fReplaceRare=   0;
    int fConstSim   =   0;
    int fDagNodes   =   0;
    float FlipProb  =   0;
    int c, fVerbose =   0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "LNURPrcdvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            Limit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Limit < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            Reps = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Reps < 0 )
                goto usage;
            break;
        case 'U':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-U\" should be followed by an integer.\n" );
                goto usage;
            }
            UnseenUse = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( UnseenUse < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            RareUse = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( RareUse < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            FlipProb = atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( FlipProb < 0 )
                goto usage;
            break;
        case 'r':
            fReplaceRare ^= 1;
            break;
        case 'c':
            fConstSim ^= 1;
            break;
        case 'd':
            fDagNodes ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Cfs(): There is no AIG.\n" );
        return 1;
    }
    Extra_CommandCfs( pAbc->pGia, Limit, Reps, UnseenUse, RareUse, fReplaceRare, fConstSim, fDagNodes, FlipProb, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &cfs [-LNURPrcdvh]\n" );
    Abc_Print( -2, "\t          performs simulation\n" );
    Abc_Print( -2, "\t-L num  : the limit on the number of occurrences [default = %d]\n",  Limit );
    Abc_Print( -2, "\t-N num  : the number of repetions of each pattern [default = %d]\n", Reps );
    Abc_Print( -2, "\t-U num  : what to do with unseen patterns [default = %d]\n",         UnseenUse );
    Abc_Print( -2, "\t-R num  : what to do with rare patterns [default = %d]\n",           RareUse );
    Abc_Print( -2, "\t-P num  : base2-log of ramdom flip probability [default = %f]\n",    FlipProb );
    Abc_Print( -2, "\t-r      : toggle replacing rare patterns [default = %s]\n",          fReplaceRare? "yes": "no" );
    Abc_Print( -2, "\t-c      : toggle inserting constants [default = %s]\n",              fConstSim? "yes": "no" );
    Abc_Print( -2, "\t-d      : toggle using only DAG nodes [default = %s]\n",             fDagNodes? "yes": "no" );
    Abc_Print( -2, "\t-v      : toggle printing verbose information [default = %s]\n",     fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}